

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O0

_Bool is_same_type(json_value *value,config_item *item)

{
  _Bool local_22;
  _Bool local_21;
  config_item *item_local;
  json_value *value_local;
  
  if ((value == (json_value *)0x0) || (item == (config_item *)0x0)) {
    value_local._7_1_ = false;
  }
  else {
    if (((((value->type != json_boolean) || (local_21 = true, item->type != cdt_bool)) &&
         ((((value->type != json_integer || (item->type != cdt_uint16)) || ((value->u).integer < 0))
          || (local_21 = true, 0xffff < (value->u).integer)))) &&
        (((value->type != json_integer || (local_21 = true, item->type != cdt_int)) &&
         ((value->type != json_double || (local_21 = true, item->type != cdt_double)))))) &&
       (((value->type != json_string || (local_21 = true, item->type != cdt_string)) &&
        ((value->type != json_object || (local_21 = true, item->type != cdt_object)))))) {
      local_22 = false;
      if (value->type == json_array) {
        local_22 = (item->list & 1U) == 1;
      }
      local_21 = local_22;
    }
    value_local._7_1_ = local_21;
  }
  return value_local._7_1_;
}

Assistant:

static bool is_same_type(json_value * value, config_item * item)
{
    if (value == NULL || item == NULL)
        return false;

    return (value->type == json_boolean && item->type == cdt_bool)
        || (value->type == json_integer && item->type == cdt_uint16
            && value->u.integer >=0 && value->u.integer < 0x10000)
        || (value->type == json_integer && item->type == cdt_int)
        || (value->type == json_double && item->type == cdt_double)
        || (value->type == json_string && item->type == cdt_string)
        || (value->type == json_object && item->type == cdt_object)
        || (value->type == json_array && item->list == true);
}